

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint16_t packed_delta3,uint32_t table_idx)

{
  byte bVar1;
  uint in_ECX;
  long lVar2;
  int y3;
  int y2;
  int y1;
  int y0;
  int ib;
  int ig;
  int ir;
  bool success;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int *pInten_modifer_table;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_ECX < 8) {
    lVar2 = (ulong)in_ECX * 0x10;
    bVar1 = unpack_color5((uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (uint32_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10),
                          (uint16_t)in_stack_ffffffffffffffcc,
                          SUB41((uint)in_stack_ffffffffffffffc8 >> 0x18,0),in_ECX);
    color_rgba::set((color_rgba *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                    in_stack_ffffffffffffffb0);
    uVar4 = *(undefined4 *)(g_etc1_inten_tables + lVar2 + 4);
    color_rgba::set((color_rgba *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                    in_stack_ffffffffffffffb0);
    uVar3 = *(undefined4 *)(g_etc1_inten_tables + lVar2 + 8);
    color_rgba::set((color_rgba *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffffbc,
                    in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    color_rgba::set((color_rgba *)CONCAT44(uVar4,uVar3),*(int *)(g_etc1_inten_tables + lVar2 + 0xc),
                    in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    return (bool)(bVar1 & 1);
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x22e,
                "static bool basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint16_t, uint32_t)"
               );
}

Assistant:

bool etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint16_t packed_delta3, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);

		return success;
	}